

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O0

void __thiscall Procedure::Procedure(Procedure *this,int *fa_,string *name_)

{
  string *name__local;
  int *fa__local;
  Procedure *this_local;
  
  std::__cxx11::string::string((string *)&this->pName);
  std::vector<Description,_std::allocator<Description>_>::vector(&this->nameTable);
  std::__cxx11::string::operator=((string *)&this->pName,(string *)name_);
  this->fa = *fa_;
  this->nowDx = 3;
  this->level = -1;
  return;
}

Assistant:

Procedure(const int &fa_, const std::string &name_) {
		pName = name_;
		fa = fa_;
		nowDx = 3;
		level = -1;
	}